

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O0

int mk_sched_remove_client(mk_sched_conn *conn,mk_sched_worker *sched,mk_server *server)

{
  mk_event *event;
  mk_server *server_local;
  mk_sched_worker *sched_local;
  mk_sched_conn *conn_local;
  
  mk_event_del(sched->loop,&conn->event);
  mk_plugin_stage_run_50((conn->event).fd,server);
  sched->closed_connections = sched->closed_connections + 1;
  mk_sched_conn_timeout_del(conn);
  (*conn->net->close)(conn->net->plugin,(conn->event).fd);
  mk_channel_clean(&conn->channel);
  mk_sched_event_free(&conn->event);
  conn->status = -2;
  return 0;
}

Assistant:

int mk_sched_remove_client(struct mk_sched_conn *conn,
                           struct mk_sched_worker *sched,
                           struct mk_server *server)
{
    struct mk_event *event;

    /*
     * Close socket and change status: we must invoke mk_epoll_del()
     * because when the socket is closed is cleaned from the queue by
     * the Kernel at its leisure, and we may get false events if we rely
     * on that.
     */
    event = &conn->event;
    MK_TRACE("[FD %i] Scheduler remove", event->fd);

    mk_event_del(sched->loop, event);

    /* Invoke plugins in stage 50 */
    mk_plugin_stage_run_50(event->fd, server);

    sched->closed_connections++;

    /* Unlink from the red-black tree */
    //rb_erase(&conn->_rb_head, &sched->rb_queue);
    mk_sched_conn_timeout_del(conn);

    /* Close at network layer level */
    conn->net->close(conn->net->plugin, event->fd);

    /* Release and return */
    mk_channel_clean(&conn->channel);
    mk_sched_event_free(&conn->event);
    conn->status = MK_SCHED_CONN_CLOSED;

    MK_LT_SCHED(remote_fd, "DELETE_CLIENT");
    return 0;
}